

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O1

void __thiscall
branch_and_reduce_algorithm::compute_alternative
          (branch_and_reduce_algorithm *this,vector<int,_std::allocator<int>_> *A,
          vector<int,_std::allocator<int>_> *B)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  pointer pvVar4;
  int *piVar5;
  pointer piVar6;
  pointer piVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  pointer piVar9;
  _func_int **pp_Var10;
  pointer psVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *pvVar12;
  void *pvVar13;
  element_type *peVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  const_iterator __begin1;
  int *piVar16;
  int *piVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  const_iterator __end1;
  uint *puVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  int *piVar27;
  vector<int,std::allocator<int>> *pvVar28;
  vector<int,std::allocator<int>> *pvVar29;
  vector<int,_std::allocator<int>_> *__range1_2;
  const_iterator __begin1_1;
  pointer piVar30;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> A2;
  vector<int,_std::allocator<int>_> vs;
  vector<int,_std::allocator<int>_> B2;
  vector<int,_std::allocator<int>_> removed;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  newAdj;
  vector<int,_std::allocator<int>_> copyOfTmp;
  undefined1 local_129;
  void *local_128;
  void *local_120;
  long local_118;
  vector<int,_std::allocator<int>_> local_110;
  void *local_f8;
  void *local_f0;
  long local_e8;
  vector<int,_std::allocator<int>_> local_e0;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  vector<int,std::allocator<int>> *local_b8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_b0;
  undefined1 local_98 [16];
  pointer local_88;
  
  piVar17 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar16 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar3 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if ((long)piVar2 - (long)piVar17 != (long)piVar3 - (long)piVar16) {
    __assert_fail("A.size() == B.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                  ,0x126,
                  "void branch_and_reduce_algorithm::compute_alternative(const std::vector<int> &, const std::vector<int> &)"
                 );
  }
  iVar20 = (this->used).uid;
  (this->used).uid = iVar20 + 1;
  if (iVar20 < -1) {
    piVar30 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar25 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar30;
    if (lVar25 != 0) {
      uVar26 = 0;
      do {
        piVar30[uVar26] = 0;
        uVar26 = uVar26 + 1;
      } while ((uVar26 & 0xffffffff) < (ulong)(lVar25 >> 2));
    }
    (this->used).uid = 1;
  }
  if (piVar16 != piVar3) {
    pvVar4 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar30 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar27 = pvVar4[*piVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 = *(pointer *)
                ((long)&pvVar4[*piVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (piVar27 != piVar5) {
        piVar6 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if (piVar30[*piVar27] < 0) {
            piVar6[*piVar27] = (this->used).uid;
          }
          piVar27 = piVar27 + 1;
        } while (piVar27 != piVar5);
      }
      piVar16 = piVar16 + 1;
    } while (piVar16 != piVar3);
  }
  for (; piVar17 != piVar2; piVar17 = piVar17 + 1) {
    pvVar4 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = *(pointer *)
              ((long)&pvVar4[*piVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (piVar16 = pvVar4[*piVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar16 != piVar3; piVar16 = piVar16 + 1) {
      iVar20 = *piVar16;
      if (((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar20] < 0) &&
         ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar20] == (this->used).uid)) {
        set(this,iVar20,1);
      }
    }
  }
  iVar20 = (this->used).uid;
  (this->used).uid = iVar20 + 1;
  if (iVar20 < -1) {
    piVar30 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar25 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar30;
    if (lVar25 != 0) {
      uVar26 = 0;
      do {
        piVar30[uVar26] = 0;
        uVar26 = uVar26 + 1;
      } while ((uVar26 & 0xffffffff) < (ulong)(lVar25 >> 2));
    }
    (this->used).uid = 1;
  }
  piVar17 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar17 != piVar2) {
    piVar30 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar30[*piVar17] = (this->used).uid;
      piVar17 = piVar17 + 1;
    } while (piVar17 != piVar2);
  }
  piVar17 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar26 = 0;
  if (piVar17 != piVar2) {
    pvVar4 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar30 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar16 = pvVar4[*piVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar3 = *(pointer *)
                ((long)&pvVar4[*piVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (piVar16 != piVar3) {
        piVar6 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar20 = *piVar16;
          if ((piVar30[iVar20] < 0) &&
             (iVar19 = (this->used).uid, iVar1 = piVar7[iVar20], piVar7[iVar20] = iVar19,
             iVar1 != iVar19)) {
            iVar19 = (int)uVar26;
            uVar26 = (ulong)(iVar19 + 1);
            piVar6[iVar19] = iVar20;
          }
          piVar16 = piVar16 + 1;
        } while (piVar16 != piVar3);
      }
      piVar17 = piVar17 + 1;
    } while (piVar17 != piVar2);
    uVar26 = (ulong)(int)uVar26;
  }
  _Var8._M_current =
       (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  std::vector<int,std::allocator<int>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&local_128,_Var8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (_Var8._M_current + uVar26),(allocator_type *)local_98);
  pvVar13 = local_120;
  pvVar12 = local_128;
  if (local_128 != local_120) {
    uVar26 = (long)local_120 - (long)local_128 >> 2;
    lVar25 = 0x3f;
    if (uVar26 != 0) {
      for (; uVar26 >> lVar25 == 0; lVar25 = lVar25 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_128,local_120,((uint)lVar25 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pvVar12,pvVar13);
  }
  iVar20 = (this->used).uid;
  (this->used).uid = iVar20 + 1;
  if (iVar20 < -1) {
    piVar30 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar25 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar30;
    if (lVar25 != 0) {
      uVar26 = 0;
      do {
        piVar30[uVar26] = 0;
        uVar26 = uVar26 + 1;
      } while ((uVar26 & 0xffffffff) < (ulong)(lVar25 >> 2));
    }
    (this->used).uid = 1;
  }
  piVar17 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar17 != piVar2) {
    piVar30 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar30[*piVar17] = (this->used).uid;
      piVar17 = piVar17 + 1;
    } while (piVar17 != piVar2);
  }
  piVar17 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar26 = 0;
  if (piVar17 != piVar2) {
    pvVar4 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar30 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar16 = pvVar4[*piVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar3 = *(pointer *)
                ((long)&pvVar4[*piVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (piVar16 != piVar3) {
        piVar6 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar20 = *piVar16;
          if ((piVar30[iVar20] < 0) &&
             (iVar19 = (this->used).uid, iVar1 = piVar7[iVar20], piVar7[iVar20] = iVar19,
             iVar1 != iVar19)) {
            iVar19 = (int)uVar26;
            uVar26 = (ulong)(iVar19 + 1);
            piVar6[iVar19] = iVar20;
          }
          piVar16 = piVar16 + 1;
        } while (piVar16 != piVar3);
      }
      piVar17 = piVar17 + 1;
    } while (piVar17 != piVar2);
    uVar26 = (ulong)(int)uVar26;
  }
  _Var8._M_current =
       (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  std::vector<int,std::allocator<int>>::
  vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,std::allocator<int>> *)&local_f8,_Var8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (_Var8._M_current + uVar26),(allocator_type *)local_98);
  pvVar13 = local_f0;
  pvVar12 = local_f8;
  if (local_f8 != local_f0) {
    uVar26 = (long)local_f0 - (long)local_f8 >> 2;
    lVar25 = 0x3f;
    if (uVar26 != 0) {
      for (; uVar26 >> lVar25 == 0; lVar25 = lVar25 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_f8,local_f0,((uint)lVar25 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pvVar12,pvVar13);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_e0,
             ((long)(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2) +
             ((long)(A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2),(allocator_type *)local_98);
  piVar30 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar6 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar25 = (long)piVar6 - (long)piVar30;
  if (lVar25 != 0) {
    uVar26 = 0;
    do {
      local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar26] = piVar30[uVar26];
      uVar26 = uVar26 + 1;
    } while ((uVar26 & 0xffffffff) < (ulong)((long)piVar6 - (long)piVar30 >> 2));
  }
  piVar30 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  lVar22 = (long)(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish - (long)piVar30;
  if (lVar22 != 0) {
    uVar26 = 0;
    do {
      *(int *)((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar26 * 4 + lVar25) = piVar30[uVar26];
      uVar26 = uVar26 + 1;
    } while ((uVar26 & 0xffffffff) < (ulong)(lVar22 >> 2));
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_110,
             ((long)local_f0 - (long)local_f8 >> 2) + ((long)local_120 - (long)local_128 >> 2),
             (allocator_type *)local_98);
  if ((long)local_120 - (long)local_128 != 0) {
    uVar26 = 0;
    do {
      local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar26] = *(int *)((long)local_128 + uVar26 * 4);
      uVar26 = uVar26 + 1;
    } while ((uVar26 & 0xffffffff) < (ulong)((long)local_120 - (long)local_128 >> 2));
  }
  if ((long)local_f0 - (long)local_f8 != 0) {
    uVar26 = 0;
    do {
      *(undefined4 *)
       ((long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + uVar26 * 4 + ((long)local_120 - (long)local_128)) =
           *(undefined4 *)((long)local_f8 + uVar26 * 4);
      uVar26 = uVar26 + 1;
    } while ((uVar26 & 0xffffffff) < (ulong)((long)local_f0 - (long)local_f8 >> 2));
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_b0,
           (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2,(allocator_type *)local_98);
  iVar20 = (this->used).uid;
  (this->used).uid = iVar20 + 1;
  if (iVar20 < -1) {
    piVar30 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar25 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar30;
    if (lVar25 != 0) {
      uVar26 = 0;
      do {
        piVar30[uVar26] = 0;
        uVar26 = uVar26 + 1;
      } while ((uVar26 & 0xffffffff) < (ulong)(lVar25 >> 2));
    }
    (this->used).uid = 1;
  }
  piVar17 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar17 != piVar2) {
    piVar30 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar30[*piVar17] = (this->used).uid;
      piVar17 = piVar17 + 1;
    } while (piVar17 != piVar2);
  }
  piVar17 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar17 != piVar2) {
    piVar30 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar30[*piVar17] = (this->used).uid;
      piVar17 = piVar17 + 1;
    } while (piVar17 != piVar2);
  }
  if (local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar26 = 0;
    do {
      uVar18 = (long)local_120 - (long)local_128 >> 2;
      pvVar28 = (vector<int,std::allocator<int>> *)&local_128;
      if (uVar26 < uVar18) {
        pvVar28 = (vector<int,std::allocator<int>> *)&local_f8;
      }
      puVar21 = (uint *)((long)local_128 + uVar26 * 4);
      if (uVar18 <= uVar26) {
        puVar21 = (uint *)((uVar26 - uVar18) * 4 + (long)local_f8);
      }
      pvVar4 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar17 = pvVar4[*puVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar2 = *(pointer *)
                ((long)&pvVar4[*puVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (piVar17 == piVar2) {
        uVar24 = 0;
        iVar20 = 0;
      }
      else {
        piVar30 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar6 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar25 = *(long *)pvVar28;
        uVar24 = 0;
        iVar19 = 0;
        do {
          iVar1 = *piVar17;
          iVar20 = iVar19;
          if ((piVar30[iVar1] < 0) && (piVar7[iVar1] != (this->used).uid)) {
            uVar23 = (ulong)(int)uVar24;
            pvVar29 = (vector<int,std::allocator<int>> *)&local_128;
            if (uVar26 < uVar18) {
              pvVar29 = (vector<int,std::allocator<int>> *)&local_f8;
            }
            if (uVar23 < (ulong)(*(long *)(pvVar29 + 8) - lVar25 >> 2)) {
              piVar9 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              do {
                iVar20 = *(int *)(lVar25 + uVar23 * 4);
                if (iVar1 < iVar20) break;
                if (piVar7[iVar20] != (this->used).uid) {
                  lVar22 = (long)iVar19;
                  iVar19 = iVar19 + 1;
                  piVar9[lVar22] = iVar20;
                }
                uVar23 = uVar23 + 1;
                pvVar29 = (vector<int,std::allocator<int>> *)&local_128;
                if (uVar26 < uVar18) {
                  pvVar29 = (vector<int,std::allocator<int>> *)&local_f8;
                }
              } while (uVar23 < (ulong)(*(long *)(pvVar29 + 8) - lVar25 >> 2));
              uVar24 = uVar23 & 0xffffffff;
            }
            if ((iVar19 == 0) || (iVar20 = iVar19, piVar6[(long)iVar19 + -1] != iVar1)) {
              iVar20 = iVar19 + 1;
              piVar6[iVar19] = iVar1;
            }
          }
          piVar17 = piVar17 + 1;
          iVar19 = iVar20;
        } while (piVar17 != piVar2);
        uVar24 = (ulong)(int)uVar24;
        local_b8 = pvVar28;
      }
      lVar25 = *(long *)pvVar28;
      pvVar28 = (vector<int,std::allocator<int>> *)&local_128;
      if (uVar26 < uVar18) {
        pvVar28 = (vector<int,std::allocator<int>> *)&local_f8;
      }
      if (uVar24 < (ulong)(*(long *)(pvVar28 + 8) - lVar25 >> 2)) {
        piVar30 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar6 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar19 = *(int *)(lVar25 + uVar24 * 4);
          if (piVar6[iVar19] != (this->used).uid) {
            lVar22 = (long)iVar20;
            iVar20 = iVar20 + 1;
            piVar30[lVar22] = iVar19;
          }
          uVar24 = uVar24 + 1;
          pvVar28 = (vector<int,std::allocator<int>> *)&local_128;
          if (uVar26 < uVar18) {
            pvVar28 = (vector<int,std::allocator<int>> *)&local_f8;
          }
        } while (uVar24 < (ulong)(*(long *)(pvVar28 + 8) - lVar25 >> 2));
      }
      _Var8._M_current =
           (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      std::vector<int,std::allocator<int>>::
      vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)local_98,_Var8,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (_Var8._M_current + iVar20),(allocator_type *)&local_c8);
      pp_Var10 = (_func_int **)
                 local_b0.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar26].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
      piVar30 = local_b0.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar26].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish;
      piVar6 = local_b0.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar26].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      local_b0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar26].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_98._0_8_;
      local_b0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar26].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_98._8_8_;
      local_b0.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar26].
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_88;
      local_98._0_8_ = pp_Var10;
      local_98._8_8_ = piVar30;
      local_88 = piVar6;
      if (pp_Var10 != (_func_int **)0x0) {
        operator_delete(pp_Var10,(long)piVar6 - (long)pp_Var10);
      }
      uVar26 = (ulong)((int)uVar26 + 1);
    } while (uVar26 < (ulong)((long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2));
  }
  alternative::alternative
            ((alternative *)local_98,
             (int)((ulong)((long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3),&local_e0,&local_110,
             &local_b0,this,(int)((ulong)((long)local_120 - (long)local_128) >> 2));
  local_c8 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<alternative,std::allocator<alternative>,alternative>
            (&_Stack_c0,(alternative **)&local_c8,(allocator<alternative> *)&local_129,
             (alternative *)local_98);
  _Var15._M_pi = _Stack_c0._M_pi;
  peVar14 = local_c8;
  iVar20 = this->modifiedN;
  this->modifiedN = iVar20 + 1;
  psVar11 = (this->modifieds).
            super__Vector_base<std::shared_ptr<modified>,_std::allocator<std::shared_ptr<modified>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = (element_type *)0x0;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = psVar11[iVar20].super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  psVar11 = psVar11 + iVar20;
  (psVar11->super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar14;
  (psVar11->super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var15._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
  }
  modified::~modified((modified *)local_98);
  if (USE_DEPENDENCY_CHECKING == true) {
    if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar30 = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        pvVar4 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar2 = *(pointer *)
                  ((long)&pvVar4[*piVar30].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (piVar17 = pvVar4[*piVar30].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar17 != piVar2; piVar17 = piVar17 + 1) {
          ArraySet::Insert(&this->dc_candidates,*piVar17);
        }
        piVar30 = piVar30 + 1;
      } while (piVar30 !=
               local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar30 = local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar20 = *piVar30;
        ArraySet::Insert(&this->dc_candidates,iVar20);
        pvVar4 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar2 = *(pointer *)
                  ((long)&pvVar4[iVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (piVar17 = pvVar4[iVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar17 != piVar2; piVar17 = piVar17 + 1) {
          ArraySet::Insert(&this->dc_candidates,*piVar17);
        }
        piVar30 = piVar30 + 1;
      } while (piVar30 !=
               local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_b0);
  if (local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8 != (void *)0x0) {
    operator_delete(local_f8,local_e8 - (long)local_f8);
  }
  if (local_128 != (void *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  return;
}

Assistant:

void branch_and_reduce_algorithm::compute_alternative(std::vector<int> const &A, std::vector<int> const &B)
{
    assert(A.size() == B.size());
    used.clear();
    for (int b : B)
        for (int u : adj[b])
            if (x[u] < 0)
                used.add(u);

    for (int a : A)
        for (int u : adj[a])
            if (x[u] < 0 && used.get(u))
                set(u, 1);
    // sets v in N(A) and N(B) to 1

    NodeID p = 0, q = 0;
    std::vector<int> &tmp = modTmp;
    used.clear();
    for (int b : B)
        used.add(b);

    for (int a : A)
        for (int u : adj[a])
            if (x[u] < 0 && used.add(u))
                tmp[p++] = u;

    std::vector<int> A2(tmp.begin(), tmp.begin() + p);
    std::sort(A2.begin(), A2.end());
    // A2 contains v in N(A)\(B and N(B))
    p = 0;
    used.clear();
    for (int a : A)
        used.add(a);
    for (int b : B)
        for (int u : adj[b])
            if (x[u] < 0 && used.add(u))
                tmp[p++] = u;

    std::vector<int> B2(tmp.begin(), tmp.begin() + p);
    std::sort(B2.begin(), B2.end());
    // B2 contains v in N(B)\(A and N(A))

    std::vector<int> removed(A.size() + B.size());
    for (unsigned int i = 0; i < A.size(); i++)
        removed[i] = A[i];
    for (unsigned int i = 0; i < B.size(); i++)
        removed[A.size() + i] = B[i];
    std::vector<int> vs(A2.size() + B2.size());
    for (unsigned int i = 0; i < A2.size(); i++)
        vs[i] = A2[i];
    for (unsigned int i = 0; i < B2.size(); i++)
        vs[A2.size() + i] = B2[i];
    std::vector<std::vector<int>> newAdj(vs.size());
    used.clear();
    for (int a : A)
        used.add(a);
    for (int b : B)
        used.add(b);
    for (unsigned int i = 0; i < vs.size(); i++)
    {
        unsigned int v = (i < A2.size()) ? A2[i] : B2[i - A2.size()];
        std::vector<int> const &C = (i < A2.size()) ? B2 : A2;
        p = q = 0;
        for (int u : adj[v])
            if (x[u] < 0 && !used.get(u))
            {
                while (q < C.size() && C[q] <= u)
                {
                    if (used.get(C[q]))
                        q++;
                    else
                        tmp[p++] = C[q++];
                }
                if (p == 0 || tmp[p - 1] != u)
                    tmp[p++] = u;
            }
        while (q < C.size())
        {
            if (used.get(C[q]))
                q++;
            else
                tmp[p++] = C[q++];
        }
        {
            std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
            newAdj[i].swap(copyOfTmp);
        }
    }

    modifieds[modifiedN++] = make_shared<alternative>(alternative(removed.size() / 2, removed, vs, newAdj, this, A2.size()));

    if (USE_DEPENDENCY_CHECKING) {
        for (int v : removed) {
            for (int n : adj[v]) {
                dc_candidates.Insert(n);
            }
        }

        for (int v : vs) {
            dc_candidates.Insert(v);
            for (int n : adj[v]) {
                dc_candidates.Insert(n);
            }
        }
    }
}